

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void MIR_gen_finish(MIR_context_t ctx)

{
  gen_ctx_t gen_ctx_00;
  gen_ctx_t *ppgVar1;
  size_t sVar2;
  void_ptr_t __ptr;
  uint local_24;
  MIR_type_t type;
  gen_ctx_t gen_ctx;
  gen_ctx_t *gen_ctx_ptr;
  MIR_context_t ctx_local;
  
  ppgVar1 = gen_ctx_loc(ctx);
  gen_ctx_00 = *ppgVar1;
  if (gen_ctx_00 == (gen_ctx_t)0x0) {
    fprintf(_stderr,"Calling MIR_gen_finish before MIR_gen_init -- good bye\n");
    exit(1);
  }
  finish_data_flow(gen_ctx_00);
  finish_ssa(gen_ctx_00);
  finish_gvn(gen_ctx_00);
  finish_live_ranges(gen_ctx_00);
  finish_coalesce(gen_ctx_00);
  finish_ra(gen_ctx_00);
  finish_combine(gen_ctx_00);
  for (local_24 = 0; local_24 < 0x13; local_24 = local_24 + 1) {
    bitmap_destroy(gen_ctx_00->call_used_hard_regs[local_24]);
  }
  bitmap_destroy(gen_ctx_00->tied_regs);
  bitmap_destroy(gen_ctx_00->addr_regs);
  bitmap_destroy(gen_ctx_00->insn_to_consider);
  bitmap_destroy(gen_ctx_00->func_used_hard_regs);
  target_finish(gen_ctx_00);
  finish_dead_vars(gen_ctx_00);
  free(gen_ctx_00->data_flow_ctx);
  bitmap_destroy(gen_ctx_00->temp_bitmap);
  bitmap_destroy(gen_ctx_00->temp_bitmap2);
  bitmap_destroy(gen_ctx_00->temp_bitmap3);
  VARR_MIR_op_tdestroy(&gen_ctx_00->temp_ops);
  VARR_MIR_insn_tdestroy(&gen_ctx_00->temp_insns);
  VARR_MIR_insn_tdestroy(&gen_ctx_00->temp_insns2);
  VARR_bb_insn_tdestroy(&gen_ctx_00->temp_bb_insns);
  VARR_bb_insn_tdestroy(&gen_ctx_00->temp_bb_insns2);
  VARR_loop_node_tdestroy(&gen_ctx_00->loop_nodes);
  VARR_loop_node_tdestroy(&gen_ctx_00->queue_nodes);
  VARR_loop_node_tdestroy(&gen_ctx_00->loop_entries);
  VARR_mem_attr_tdestroy(&gen_ctx_00->mem_attrs);
  VARR_target_bb_version_tdestroy(&gen_ctx_00->target_succ_bb_versions);
  VARR_void_ptr_tdestroy(&gen_ctx_00->succ_bb_addrs);
  VARR_spot_attr_tdestroy(&gen_ctx_00->spot_attrs);
  VARR_spot_attr_tdestroy(&gen_ctx_00->spot2attr);
  while( true ) {
    sVar2 = VARR_void_ptr_tlength(gen_ctx_00->to_free);
    if (sVar2 == 0) break;
    __ptr = VARR_void_ptr_tpop(gen_ctx_00->to_free);
    free(__ptr);
  }
  VARR_void_ptr_tdestroy(&gen_ctx_00->to_free);
  free(gen_ctx_00);
  *ppgVar1 = (gen_ctx_t)0x0;
  return;
}

Assistant:

void MIR_gen_finish (MIR_context_t ctx) {
  gen_ctx_t *gen_ctx_ptr = gen_ctx_loc (ctx), gen_ctx = *gen_ctx_ptr;

  if (gen_ctx == NULL) {
    fprintf (stderr, "Calling MIR_gen_finish before MIR_gen_init -- good bye\n");
    exit (1);
  }
  finish_data_flow (gen_ctx);
  finish_ssa (gen_ctx);
  finish_gvn (gen_ctx);
  finish_live_ranges (gen_ctx);
  finish_coalesce (gen_ctx);
  finish_ra (gen_ctx);
  finish_combine (gen_ctx);
  for (MIR_type_t type = MIR_T_I8; type < MIR_T_BOUND; type++)
    bitmap_destroy (call_used_hard_regs[type]);
  bitmap_destroy (tied_regs);
  bitmap_destroy (addr_regs);
  bitmap_destroy (insn_to_consider);
  bitmap_destroy (func_used_hard_regs);
  target_finish (gen_ctx);
  finish_dead_vars (gen_ctx);
  free (gen_ctx->data_flow_ctx);
  bitmap_destroy (temp_bitmap);
  bitmap_destroy (temp_bitmap2);
  bitmap_destroy (temp_bitmap3);
  VARR_DESTROY (MIR_op_t, temp_ops);
  VARR_DESTROY (MIR_insn_t, temp_insns);
  VARR_DESTROY (MIR_insn_t, temp_insns2);
  VARR_DESTROY (bb_insn_t, temp_bb_insns);
  VARR_DESTROY (bb_insn_t, temp_bb_insns2);
  VARR_DESTROY (loop_node_t, loop_nodes);
  VARR_DESTROY (loop_node_t, queue_nodes);
  VARR_DESTROY (loop_node_t, loop_entries);
  VARR_DESTROY (mem_attr_t, mem_attrs);
  VARR_DESTROY (target_bb_version_t, target_succ_bb_versions);
  VARR_DESTROY (void_ptr_t, succ_bb_addrs);
  VARR_DESTROY (spot_attr_t, spot_attrs);
  VARR_DESTROY (spot_attr_t, spot2attr);
  while (VARR_LENGTH (void_ptr_t, to_free) != 0) free (VARR_POP (void_ptr_t, to_free));
  VARR_DESTROY (void_ptr_t, to_free);
  if (collect_bb_stat_p)
    fprintf (stderr, "Overall bbs num = %llu, generated bbs num = %llu\n", overall_bbs_num,
             overall_gen_bbs_num);
  free (gen_ctx);
  *gen_ctx_ptr = NULL;
}